

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int maxn(lua_State *L)

{
  int iVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined8 local_10;
  undefined1 extraout_var [56];
  
  luaL_checktype(L,1,5);
  lua_pushnil(L);
  iVar1 = lua_next(L,1);
  if (iVar1 == 0) {
    local_10 = 0.0;
  }
  else {
    local_10 = 0.0;
    do {
      lua_settop(L,-2);
      iVar1 = lua_type(L,-1);
      if (iVar1 == 3) {
        auVar2._0_8_ = lua_tonumberx(L,-1,(int *)0x0);
        auVar2._8_56_ = extraout_var;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_10;
        auVar3 = vmaxsd_avx(auVar2._0_16_,auVar3);
        local_10 = auVar3._0_8_;
      }
      iVar1 = lua_next(L,1);
    } while (iVar1 != 0);
  }
  lua_pushnumber(L,local_10);
  return 1;
}

Assistant:

static int maxn (lua_State *L) {
  lua_Number max = 0;
  luaL_checktype(L, 1, LUA_TTABLE);
  lua_pushnil(L);  /* first key */
  while (lua_next(L, 1)) {
    lua_pop(L, 1);  /* remove value */
    if (lua_type(L, -1) == LUA_TNUMBER) {
      lua_Number v = lua_tonumber(L, -1);
      if (v > max) max = v;
    }
  }
  lua_pushnumber(L, max);
  return 1;
}